

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_attributes(lyd_node *node,char *data,int options,unres_data *unres,lyb_state *lybs)

{
  void *pvVar1;
  char *pcVar2;
  lys_ext_instance_complex *local_68;
  lys_ext_instance_complex *ext;
  lyd_attr *attr;
  lys_type **type;
  lys_module *mod;
  int local_40;
  uint8_t count;
  int iStack_3c;
  uint8_t i;
  int ret;
  int r;
  lyb_state *lybs_local;
  unres_data *unres_local;
  char *pcStack_20;
  int options_local;
  char *data_local;
  lyd_node *node_local;
  
  local_40 = 0;
  mod._6_1_ = 0;
  ext = (lys_ext_instance_complex *)0x0;
  _ret = lybs;
  lybs_local = (lyb_state *)unres;
  unres_local._4_4_ = options;
  pcStack_20 = data;
  data_local = (char *)node;
  iStack_3c = lyb_read(data,(uint8_t *)((long)&mod + 6),1,lybs);
  local_40 = iStack_3c + local_40;
  if (iStack_3c < 0) {
LAB_00164976:
    lyd_free_attr(_ret->ctx,(lyd_node *)data_local,*(lyd_attr **)(data_local + 0x10),1);
    node_local._4_4_ = -1;
  }
  else {
    pcStack_20 = pcStack_20 + iStack_3c;
    for (mod._7_1_ = 0; mod._7_1_ < mod._6_1_; mod._7_1_ = mod._7_1_ + 1) {
      iStack_3c = lyb_read_start_subtree(pcStack_20,_ret);
      local_40 = iStack_3c + local_40;
      if (iStack_3c < 0) goto LAB_00164976;
      pcStack_20 = pcStack_20 + iStack_3c;
      iStack_3c = lyb_parse_model(pcStack_20,(lys_module **)&type,_ret);
      local_40 = iStack_3c + local_40;
      if (iStack_3c < 0) goto LAB_00164976;
      pcStack_20 = pcStack_20 + iStack_3c;
      if (type != (lys_type **)0x0) {
        iStack_3c = lyb_parse_attr_name((lys_module *)type,pcStack_20,&local_68,unres_local._4_4_,
                                        _ret);
        local_40 = iStack_3c + local_40;
        if (iStack_3c < 0) goto LAB_00164976;
        pcStack_20 = pcStack_20 + iStack_3c;
      }
      if ((type == (lys_type **)0x0) || (local_68 == (lys_ext_instance_complex *)0x0)) {
        do {
          iStack_3c = lyb_read(pcStack_20,(uint8_t *)0x0,_ret->written[_ret->used + -1],_ret);
          local_40 = iStack_3c + local_40;
          if (iStack_3c < 0) goto LAB_00164976;
          pcStack_20 = pcStack_20 + iStack_3c;
        } while (_ret->written[_ret->used + -1] != 0);
      }
      else {
        if (ext == (lys_ext_instance_complex *)0x0) {
          if (*(long *)(data_local + 0x10) != 0) {
            __assert_fail("!node->attr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                          ,0x348,
                          "int lyb_parse_attributes(struct lyd_node *, const char *, int, struct unres_data *, struct lyb_state *)"
                         );
          }
          ext = (lys_ext_instance_complex *)calloc(1,0x38);
          if (ext == (lys_ext_instance_complex *)0x0) {
            ly_log(_ret->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyb_parse_attributes");
            goto LAB_00164976;
          }
          *(lys_ext_instance_complex **)(data_local + 0x10) = ext;
        }
        else {
          pvVar1 = calloc(1,0x38);
          ext->parent = pvVar1;
          if (ext->parent == (void *)0x0) {
            ly_log(_ret->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyb_parse_attributes");
            goto LAB_00164976;
          }
          ext = (lys_ext_instance_complex *)ext->parent;
        }
        ext->arg_value = (char *)local_68;
        pcVar2 = lydict_insert(_ret->ctx,*(char **)(ext->arg_value + 0x10),0);
        *(char **)&ext->flags = pcVar2;
        attr = (lyd_attr *)
               lys_ext_complex_get_substmt
                         (LY_STMT_TYPE,(lys_ext_instance_complex *)ext->arg_value,
                          (lyext_substmt **)0x0);
        if ((attr == (lyd_attr *)0x0) || (attr->parent == (lyd_node *)0x0)) goto LAB_00164976;
        iStack_3c = lyb_parse_value((lys_type *)attr->parent,(lyd_node_leaf_list *)0x0,
                                    (lyd_attr *)ext,pcStack_20,(unres_data *)lybs_local,_ret);
        local_40 = iStack_3c + local_40;
        if (iStack_3c < 0) goto LAB_00164976;
        pcStack_20 = pcStack_20 + iStack_3c;
      }
      lyb_read_stop_subtree(_ret);
    }
    node_local._4_4_ = local_40;
  }
  return node_local._4_4_;
}

Assistant:

static int
lyb_parse_attributes(struct lyd_node *node, const char *data, int options, struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t i, count = 0;
    const struct lys_module *mod;
    struct lys_type **type;
    struct lyd_attr *attr = NULL;
    struct lys_ext_instance_complex *ext;

    /* read number of attributes stored */
    ret += (r = lyb_read(data, &count, 1, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* read attributes */
    for (i = 0; i < count; ++i) {
        ret += (r = lyb_read_start_subtree(data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        /* find model */
        ret += (r = lyb_parse_model(data, &mod, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        if (mod) {
            /* annotation name */
            ret += (r = lyb_parse_attr_name(mod, data, &ext, options, lybs));
            LYB_HAVE_READ_GOTO(r, data, error);
        }

        if (!mod || !ext) {
            /* unknown attribute, skip it */
            do {
                ret += (r = lyb_read(data, NULL, lybs->written[lybs->used - 1], lybs));
                LYB_HAVE_READ_GOTO(r, data, error);
            } while (lybs->written[lybs->used - 1]);
            goto stop_subtree;
        }

        /* allocate new attribute */
        if (!attr) {
            assert(!node->attr);

            attr = calloc(1, sizeof *attr);
            LY_CHECK_ERR_GOTO(!attr, LOGMEM(lybs->ctx), error);

            node->attr = attr;
        } else {
            attr->next = calloc(1, sizeof *attr);
            LY_CHECK_ERR_GOTO(!attr->next, LOGMEM(lybs->ctx), error);

            attr = attr->next;
        }

        /* attribute annotation */
        attr->annotation = ext;

        /* attribute name */
        attr->name = lydict_insert(lybs->ctx, attr->annotation->arg_value, 0);

        /* get the type */
        type = (struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, attr->annotation, NULL);
        if (!type || !(*type)) {
            goto error;
        }

        /* attribute value */
        ret += (r = lyb_parse_value(*type, NULL, attr, data, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

stop_subtree:
        lyb_read_stop_subtree(lybs);
    }

    return ret;

error:
    lyd_free_attr(lybs->ctx, node, node->attr, 1);
    return -1;
}